

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* CoreML::enumeratedSizesOf
            (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *__return_storage_ptr__,ImageFeatureType *params)

{
  int iVar1;
  ImageFeatureType_EnumeratedImageSizes *pIVar2;
  ImageFeatureType_ImageSize *pIVar3;
  uint64 local_58;
  uint64 local_50;
  undefined1 local_48 [8];
  vector<long,_std::allocator<long>_> size;
  int local_20;
  int i;
  ImageFeatureType *params_local;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *sizes;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(__return_storage_ptr__);
  local_20 = 0;
  while( true ) {
    pIVar2 = Specification::ImageFeatureType::enumeratedsizes(params);
    iVar1 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes_size(pIVar2);
    if (iVar1 <= local_20) break;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_48);
    pIVar2 = Specification::ImageFeatureType::enumeratedsizes(params);
    pIVar3 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar2,local_20);
    local_50 = Specification::ImageFeatureType_ImageSize::width(pIVar3);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)local_48,(value_type_conflict1 *)&local_50);
    pIVar2 = Specification::ImageFeatureType::enumeratedsizes(params);
    pIVar3 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar2,local_20);
    local_58 = Specification::ImageFeatureType_ImageSize::height(pIVar3);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)local_48,(value_type_conflict1 *)&local_58);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_48);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_48);
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<int64_t>> enumeratedSizesOf(const Specification::ImageFeatureType &params) {
        std::vector<std::vector<int64_t>> sizes;
        for (int i=0; i<params.enumeratedsizes().sizes_size(); i++) {
            std::vector<int64_t> size;
            size.push_back((int64_t)params.enumeratedsizes().sizes(i).width());
            size.push_back((int64_t)params.enumeratedsizes().sizes(i).height());
            sizes.push_back(size);
        }
        return sizes;
    }